

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::invalid_option_format_error::~invalid_option_format_error
          (invalid_option_format_error *this)

{
  invalid_option_format_error *this_local;
  
  ~invalid_option_format_error(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit invalid_option_format_error(const std::string& format)
    : OptionSpecException("Invalid option format " + LQUOTE + format + RQUOTE)
    {
    }